

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

void pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliques(HighsMipSolver_const&,std::vector<int,std::allocator<int>>&,std::vector<double,std::allocator<double>>&,std::vector<signed_char,std::allocator<signed_char>>&,double,int,std::vector<int,std::allocator<int>>&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,double)::__1>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_8_1_8992ca70 comp)

{
  bool bVar1;
  difference_type n;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_RDX;
  undefined1 in_stack_000002db;
  int in_stack_000002dc;
  anon_class_8_1_8992ca70 in_stack_000002e0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_000002e8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_000002f0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffd0;
  
  bVar1 = __gnu_cxx::operator==(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (!bVar1) {
    n = __gnu_cxx::operator-(in_RDX,in_stack_ffffffffffffffc8);
    pdqsort_detail::log2<long>(n);
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliques(HighsMipSolver_const&,std::vector<int,std::allocator<int>>&,std::vector<double,std::allocator<double>>&,std::vector<signed_char,std::allocator<signed_char>>&,double,int,std::vector<int,std::allocator<int>>&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,double)::__1,false>
              (in_stack_000002f0,in_stack_000002e8,in_stack_000002e0,in_stack_000002dc,
               (bool)in_stack_000002db);
  }
  return;
}

Assistant:

inline void pdqsort(Iter begin, Iter end, Compare comp) {
    if (begin == end) return;

#if __cplusplus >= 201103L
    pdqsort_detail::pdqsort_loop<Iter, Compare,
        pdqsort_detail::is_default_compare<typename std::decay<Compare>::type>::value &&
        std::is_arithmetic<typename std::iterator_traits<Iter>::value_type>::value>(
        begin, end, comp, pdqsort_detail::log2(end - begin));
#else
    pdqsort_detail::pdqsort_loop<Iter, Compare, false>(
        begin, end, comp, pdqsort_detail::log2(end - begin));
#endif
}